

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Core.cpp
# Opt level: O2

void __thiscall
IRCCorePlugin::OnGenericCommandRemove(IRCCorePlugin *this,GenericCommand *in_command)

{
  GenericCommand *pGVar1;
  const_iterator __position;
  
  __position._M_current =
       (this->m_wrapped_commands).
       super__Vector_base<std::unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>,_std::allocator<std::unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (__position._M_current ==
        (this->m_wrapped_commands).
        super__Vector_base<std::unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>,_std::allocator<std::unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    pGVar1 = (GenericCommand *)GenericCommandWrapperIRCCommand::getGenericCommand();
    if (pGVar1 == in_command) break;
    __position._M_current = __position._M_current + 1;
  }
  std::
  vector<std::unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>,_std::allocator<std::unique_ptr<GenericCommandWrapperIRCCommand,_std::default_delete<GenericCommandWrapperIRCCommand>_>_>_>
  ::erase(&this->m_wrapped_commands,__position);
  return;
}

Assistant:

void IRCCorePlugin::OnGenericCommandRemove(Jupiter::GenericCommand &in_command) {
	for (auto itr = m_wrapped_commands.begin(); itr != m_wrapped_commands.end(); ++itr) {
		if (&(*itr)->getGenericCommand() == &in_command) {
			m_wrapped_commands.erase(itr);
			return;
		}
	}
}